

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_iso.c
# Opt level: O1

REF_STATUS ref_iso_ghost(REF_GRID_conflict iso_grid,REF_EDGE ref_edge,REF_INT *new_node)

{
  int iVar1;
  REF_NODE pRVar2;
  REF_DBL *pRVar3;
  bool bVar4;
  uint uVar5;
  REF_DBL *data;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  size_t sVar10;
  long lVar11;
  REF_GLOB *unaff_RBP;
  char *pcVar12;
  REF_DBL *pRVar13;
  REF_INT node;
  REF_INT part;
  uint local_64;
  int local_54;
  REF_INT *local_50;
  REF_GRID_conflict local_48;
  REF_MPI local_40;
  int local_34;
  
  local_40 = iso_grid->mpi;
  iVar1 = ref_edge->n;
  local_48 = iso_grid;
  if ((long)iVar1 < 0) {
    bVar4 = false;
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",0x29,
           "ref_iso_ghost","malloc edge_global of REF_GLOB negative");
    sVar10 = 1;
  }
  else {
    sVar10 = (long)iVar1 * 8;
    unaff_RBP = (REF_GLOB *)malloc(sVar10);
    if (unaff_RBP == (REF_GLOB *)0x0) {
      bVar4 = false;
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",0x29,
             "ref_iso_ghost","malloc edge_global of REF_GLOB NULL");
      sVar10 = 2;
      unaff_RBP = (REF_GLOB *)0x0;
    }
    else {
      bVar4 = true;
      if (iVar1 != 0) {
        memset(unaff_RBP,0xff,sVar10);
      }
    }
  }
  local_64 = (uint)sVar10;
  if (!bVar4) {
    return local_64;
  }
  iVar1 = ref_edge->n;
  if ((long)iVar1 < 0) {
    bVar4 = false;
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",0x2a,
           "ref_iso_ghost","malloc edge_part of REF_INT negative");
    local_64 = 1;
  }
  else {
    sVar10 = (long)iVar1 * 4;
    local_50 = (REF_INT *)malloc(sVar10);
    if (local_50 == (REF_INT *)0x0) {
      bVar4 = false;
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",0x2a,
             "ref_iso_ghost","malloc edge_part of REF_INT NULL");
      local_64 = 2;
      local_50 = (REF_INT *)0x0;
    }
    else {
      bVar4 = true;
      if (iVar1 != 0) {
        memset(local_50,0xff,sVar10);
      }
    }
  }
  if (!bVar4) {
    return local_64;
  }
  uVar8 = (ulong)(uint)ref_edge->n;
  if (ref_edge->n < 0) {
    local_64 = 1;
    pcVar12 = "malloc edge_real of REF_DBL negative";
  }
  else {
    data = (REF_DBL *)malloc(uVar8 * 0x78);
    if (data != (REF_DBL *)0x0) {
      bVar4 = true;
      if (uVar8 != 0) {
        uVar6 = 1;
        if (1 < (int)(uVar8 * 0xf)) {
          uVar6 = uVar8 * 0xf & 0xffffffff;
        }
        uVar8 = 0;
        do {
          data[uVar8] = -999.0;
          uVar8 = uVar8 + 1;
        } while (uVar6 != uVar8);
      }
      goto LAB_001a9f55;
    }
    local_64 = 2;
    pcVar12 = "malloc edge_real of REF_DBL NULL";
  }
  bVar4 = false;
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",0x2c,
         "ref_iso_ghost",pcVar12);
  data = (REF_DBL *)0x0;
LAB_001a9f55:
  if (bVar4) {
    if (0 < ref_edge->n) {
      lVar11 = 0;
      pRVar13 = data;
      do {
        local_54 = new_node[lVar11];
        if (local_54 != -1) {
          uVar5 = ref_edge_part(ref_edge,(REF_INT)lVar11,&local_34);
          if (uVar5 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",
                   0x31,"ref_iso_ghost",(ulong)uVar5,"edge part");
            return uVar5;
          }
          if (local_40->id == local_34) {
            lVar7 = (long)local_54;
            lVar9 = -1;
            if (((-1 < lVar7) && (local_54 < local_48->node->max)) &&
               (lVar9 = local_48->node->global[lVar7], lVar9 < 0)) {
              lVar9 = -1;
            }
            unaff_RBP[lVar11] = lVar9;
            pRVar2 = local_48->node;
            local_50[lVar11] = pRVar2->part[lVar7];
            pRVar3 = pRVar2->real;
            lVar9 = 0;
            do {
              pRVar13[lVar9] = pRVar3[local_54 * 0xf + lVar9];
              lVar9 = lVar9 + 1;
            } while (lVar9 != 0xf);
          }
        }
        lVar11 = lVar11 + 1;
        pRVar13 = pRVar13 + 0xf;
      } while (lVar11 < ref_edge->n);
    }
    local_64 = ref_edge_ghost_glob(ref_edge,local_40,unaff_RBP);
    if (local_64 == 0) {
      local_64 = ref_edge_ghost_int(ref_edge,local_40,local_50);
      if (local_64 == 0) {
        local_64 = ref_edge_ghost_dbl(ref_edge,local_40,data,0xf);
        if (local_64 == 0) {
          if (0 < ref_edge->n) {
            lVar11 = 0;
            pRVar13 = data;
            do {
              if (unaff_RBP[lVar11] != -1) {
                uVar5 = ref_node_add(local_48->node,unaff_RBP[lVar11],&local_54);
                if (uVar5 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c"
                         ,0x45,"ref_iso_ghost",(ulong)uVar5,"add node");
                  return uVar5;
                }
                new_node[lVar11] = local_54;
                pRVar2 = local_48->node;
                pRVar2->part[local_54] = local_50[lVar11];
                pRVar3 = pRVar2->real;
                lVar9 = 0;
                do {
                  pRVar3[(long)local_54 * 0xf + lVar9] = pRVar13[lVar9];
                  lVar9 = lVar9 + 1;
                } while (lVar9 != 0xf);
              }
              lVar11 = lVar11 + 1;
              pRVar13 = pRVar13 + 0xf;
            } while (lVar11 < ref_edge->n);
          }
          if (data != (REF_DBL *)0x0) {
            free(data);
          }
          if (local_50 != (REF_INT *)0x0) {
            free(local_50);
          }
          local_64 = 0;
          if (unaff_RBP != (REF_GLOB *)0x0) {
            free(unaff_RBP);
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",
                 0x3f,"ref_iso_ghost",(ulong)local_64,"xyz ghost");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",0x3d,
               "ref_iso_ghost",(ulong)local_64,"part ghost");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_iso.c",0x3c,
             "ref_iso_ghost",(ulong)local_64,"global ghost");
    }
  }
  return local_64;
}

Assistant:

REF_FCN static REF_STATUS ref_iso_ghost(REF_GRID iso_grid, REF_EDGE ref_edge,
                                        REF_INT *new_node) {
  REF_MPI ref_mpi = ref_grid_mpi(iso_grid);
  REF_GLOB *edge_global;
  REF_INT *edge_part;
  REF_DBL *edge_real;
  REF_INT edge, node, part, i;
  REF_GLOB global;

  ref_malloc_init(edge_global, ref_edge_n(ref_edge), REF_GLOB, REF_EMPTY);
  ref_malloc_init(edge_part, ref_edge_n(ref_edge), REF_INT, REF_EMPTY);
  ref_malloc_init(edge_real, REF_NODE_REAL_PER * ref_edge_n(ref_edge), REF_DBL,
                  -999.0);

  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    node = new_node[edge];
    if (REF_EMPTY != node) {
      RSS(ref_edge_part(ref_edge, edge, &part), "edge part");
      if (ref_mpi_rank(ref_mpi) == part) {
        edge_global[edge] = ref_node_global(ref_grid_node(iso_grid), node);
        edge_part[edge] = ref_node_part(ref_grid_node(iso_grid), node);
        for (i = 0; i < REF_NODE_REAL_PER; i++)
          edge_real[i + REF_NODE_REAL_PER * edge] =
              ref_node_real(ref_grid_node(iso_grid), i, node);
      }
    }
  }

  RSS(ref_edge_ghost_glob(ref_edge, ref_mpi, edge_global), "global ghost");
  RSS(ref_edge_ghost_int(ref_edge, ref_mpi, edge_part), "part ghost");
  RSS(ref_edge_ghost_dbl(ref_edge, ref_mpi, edge_real, REF_NODE_REAL_PER),
      "xyz ghost");

  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    global = edge_global[edge];
    if (REF_EMPTY != global) {
      /* finds local if already inserted */
      RSS(ref_node_add(ref_grid_node(iso_grid), global, &node), "add node");
      new_node[edge] = node;
      ref_node_part(ref_grid_node(iso_grid), node) = edge_part[edge];
      for (i = 0; i < REF_NODE_REAL_PER; i++)
        ref_node_real(ref_grid_node(iso_grid), i, node) =
            edge_real[i + REF_NODE_REAL_PER * edge];
    }
  }

  ref_free(edge_real);
  ref_free(edge_part);
  ref_free(edge_global);

  return REF_SUCCESS;
}